

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

JavaHprofConfig * __thiscall
perfetto::protos::gen::JavaHprofConfig::operator=(JavaHprofConfig *this,JavaHprofConfig *param_1)

{
  JavaHprofConfig *param_1_local;
  JavaHprofConfig *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->process_cmdline_,&param_1->process_cmdline_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->pid_,&param_1->pid_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->target_installed_by_,&param_1->target_installed_by_);
  protozero::CopyablePtr<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>::operator=
            (&this->continuous_dump_config_,&param_1->continuous_dump_config_);
  this->min_anonymous_memory_kb_ = param_1->min_anonymous_memory_kb_;
  this->dump_smaps_ = param_1->dump_smaps_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignored_types_,&param_1->ignored_types_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool JavaHprofConfig::operator==(const JavaHprofConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && process_cmdline_ == other.process_cmdline_
   && pid_ == other.pid_
   && target_installed_by_ == other.target_installed_by_
   && continuous_dump_config_ == other.continuous_dump_config_
   && min_anonymous_memory_kb_ == other.min_anonymous_memory_kb_
   && dump_smaps_ == other.dump_smaps_
   && ignored_types_ == other.ignored_types_;
}